

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSVarRef * js_create_module_var(JSContext *ctx,BOOL is_lexical)

{
  uint8_t *puVar1;
  JSRuntime *pJVar2;
  list_head *plVar3;
  JSVarRef *pJVar4;
  list_head *plVar5;
  
  pJVar4 = (JSVarRef *)js_malloc(ctx,0x30);
  if (pJVar4 != (JSVarRef *)0x0) {
    (pJVar4->field_0).header.ref_count = 1;
    (pJVar4->value).u.int32 = 0;
    (pJVar4->value).tag = 4 - (ulong)(is_lexical == 0);
    pJVar4->pvalue = &pJVar4->value;
    puVar1 = &(pJVar4->field_0).header.dummy1;
    *puVar1 = *puVar1 | 1;
    pJVar2 = ctx->rt;
    (pJVar4->field_0).field_1.__gc_mark = '\x03';
    plVar5 = (list_head *)((long)&pJVar4->field_0 + 8);
    plVar3 = (pJVar2->gc_obj_list).prev;
    plVar3->next = plVar5;
    (pJVar4->field_0).header.link.prev = plVar3;
    (pJVar4->field_0).header.link.next = &pJVar2->gc_obj_list;
    (pJVar2->gc_obj_list).prev = plVar5;
  }
  return pJVar4;
}

Assistant:

static JSVarRef *js_create_module_var(JSContext *ctx, BOOL is_lexical)
{
    JSVarRef *var_ref;
    var_ref = js_malloc(ctx, sizeof(JSVarRef));
    if (!var_ref)
        return NULL;
    var_ref->header.ref_count = 1;
    if (is_lexical)
        var_ref->value = JS_UNINITIALIZED;
    else
        var_ref->value = JS_UNDEFINED;
    var_ref->pvalue = &var_ref->value;
    var_ref->is_detached = TRUE;
    add_gc_object(ctx->rt, &var_ref->header, JS_GC_OBJ_TYPE_VAR_REF);
    return var_ref;
}